

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int lemon_sprintf(char *str,char *format,...)

{
  byte bVar1;
  char cVar2;
  ushort *puVar3;
  bool bVar4;
  char in_AL;
  int iVar5;
  int extraout_EAX;
  ushort **ppuVar6;
  uint *puVar7;
  uint *puVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  byte bVar14;
  undefined8 in_RCX;
  ulong uVar15;
  uint *puVar16;
  int iVar17;
  int __type;
  undefined8 in_RDX;
  byte *pbVar18;
  char *__ptr;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  char *__s;
  long lVar22;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int nUsed;
  va_list ap;
  char zTemp [50];
  byte local_170 [4];
  uint local_16c;
  uint *local_168;
  undefined1 *local_160;
  uint local_158;
  undefined4 uStack_154;
  uint *local_150;
  undefined1 *local_148;
  byte *local_138;
  char *local_130;
  byte abStack_f7 [15];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_160 = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  puVar16 = (uint *)&nUsed;
  local_158 = 0x10;
  uStack_154 = 0x30;
  local_170[0] = 0;
  local_170[1] = 0;
  local_170[2] = 0;
  local_170[3] = 0;
  *str = '\0';
  local_16c = 0x10;
  local_130 = format + 1;
  uVar19 = 0;
  iVar5 = 0;
  local_150 = puVar16;
  local_148 = local_160;
  local_138 = (byte *)format;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
LAB_0010a390:
  lVar22 = (long)(int)uVar19;
  if (((byte *)format)[lVar22] == 0x25) {
    pbVar18 = local_170;
    local_168 = puVar16;
    lemon_addtext(str,(int *)pbVar18,(char *)((byte *)format + iVar5),uVar19 - iVar5,0);
    uVar20 = (uint)(lVar22 + 1U);
    bVar1 = ((byte *)format)[lVar22 + 1];
    ppuVar6 = __ctype_b_loc();
    puVar3 = *ppuVar6;
    if (((*(byte *)((long)puVar3 + (ulong)bVar1 * 2 + 1) & 8) != 0) ||
       ((bVar14 = bVar1, iVar5 = 0, bVar1 == 0x2d &&
        (format = (char *)local_138, bVar14 = 0x2d,
        (*(byte *)((long)puVar3 + (ulong)local_138[lVar22 + 2] * 2 + 1) & 8) != 0)))) {
      uVar21 = lVar22 + 1U & 0xffffffff;
      if (bVar1 == 0x2d) {
        uVar21 = (ulong)(uVar19 + 2);
      }
      uVar20 = (uint)uVar21;
      pbVar18 = (byte *)(long)(int)uVar20;
      bVar14 = ((byte *)format)[(long)pbVar18];
      uVar15 = (ulong)bVar14;
      iVar17 = 0;
      if ((*(byte *)((long)puVar3 + uVar15 * 2 + 1) & 8) != 0) {
        pbVar18 = pbVar18 + (long)local_130;
        iVar17 = 0;
        do {
          iVar17 = (int)(char)uVar15 + iVar17 * 10 + -0x30;
          bVar14 = *pbVar18;
          uVar15 = (ulong)bVar14;
          uVar20 = (int)uVar21 + 1;
          uVar21 = (ulong)uVar20;
          pbVar18 = pbVar18 + 1;
        } while ((*(byte *)((long)puVar3 + uVar15 * 2 + 1) & 8) != 0);
      }
      iVar5 = -iVar17;
      if (bVar1 != 0x2d) {
        iVar5 = iVar17;
      }
    }
    uVar19 = uVar20;
    if ((char)bVar14 < 'd') {
      if (bVar14 != 0x25) {
        if ((bVar14 == 0x2e) &&
           (pbVar18 = local_138,
           local_138[(long)(int)uVar19 + 2] == 0x73 && *(short *)(local_138 + (int)uVar19) == 0x2a2e
           )) {
          if (local_16c < 0x29) {
            uVar21 = (ulong)local_16c;
            local_16c = local_16c + 8;
            puVar7 = local_168;
            puVar16 = (uint *)(local_160 + uVar21);
            local_158 = local_16c;
          }
          else {
            puVar7 = local_168 + 2;
            puVar16 = local_168;
            local_150 = puVar7;
          }
          uVar20 = *puVar16;
          if (local_16c < 0x29) {
            uVar21 = (ulong)local_16c;
            local_16c = local_16c + 8;
            puVar8 = (uint *)(local_160 + uVar21);
            puVar16 = puVar7;
            local_158 = local_16c;
          }
          else {
            puVar16 = puVar7 + 2;
            puVar8 = puVar7;
            local_150 = puVar16;
          }
          uVar19 = uVar19 + 2;
          pbVar18 = *(byte **)puVar8;
          goto LAB_0010a64e;
        }
LAB_0010a69e:
        lemon_sprintf_cold_1();
        pcVar9 = strrchr(format,0x2f);
        if (pcVar9 != (char *)0x0) {
          cVar2 = *pcVar9;
          *pcVar9 = '\0';
          sVar10 = strlen(format);
          sVar11 = strlen((char *)pbVar18);
          pcVar12 = (char *)malloc((long)(((ulong)(uint)((int)sVar10 + (int)sVar11) << 0x20) +
                                         0x200000000) >> 0x20);
          if (pcVar12 != (char *)0x0) {
            lemon_sprintf(pcVar12,"%s/%s",format,pbVar18);
          }
          *pcVar9 = cVar2;
          goto LAB_0010a81e;
        }
        pcVar12 = getenv("PATH");
        pcVar9 = ".:/bin:/usr/bin";
        if (pcVar12 != (char *)0x0) {
          pcVar9 = pcVar12;
        }
        sVar10 = strlen(pcVar9);
        pcVar13 = (char *)malloc((long)((int)sVar10 + 1));
        sVar11 = strlen((char *)pbVar18);
        pcVar12 = (char *)malloc((long)(((ulong)(uint)((int)sVar10 + (int)sVar11) << 0x20) +
                                       0x200000000) >> 0x20);
        __ptr = (char *)0x0;
        if ((pcVar13 == (char *)0x0) || (pcVar12 == (char *)0x0)) goto LAB_0010a819;
        lVar22 = 0;
        do {
          cVar2 = pcVar9[lVar22];
          pcVar13[lVar22] = cVar2;
          lVar22 = lVar22 + 1;
          __s = pcVar13;
        } while (cVar2 != '\0');
        do {
          __ptr = pcVar13;
          if (*__s == '\0') break;
          pcVar9 = strchr(__s,0x3a);
          if (pcVar9 == (char *)0x0) {
            sVar10 = strlen(__s);
            pcVar9 = __s + (int)sVar10;
          }
          cVar2 = *pcVar9;
          *pcVar9 = '\0';
          lemon_sprintf(pcVar12,"%s/%s",__s,pbVar18);
          *pcVar9 = cVar2;
          if (cVar2 == '\0') {
            *__s = '\0';
          }
          else {
            __s = pcVar9 + 1;
          }
          iVar5 = access(pcVar12,__type);
        } while (iVar5 != 0);
LAB_0010a819:
        free(__ptr);
LAB_0010a81e:
        return (int)pcVar12;
      }
      lemon_addtext(str,(int *)local_170,"%",1,0);
      puVar16 = local_168;
    }
    else {
      puVar16 = local_168;
      if (bVar14 == 0x73) {
        if (local_16c < 0x29) {
          uVar21 = (ulong)local_16c;
          local_16c = local_16c + 8;
          puVar7 = (uint *)(local_160 + uVar21);
          local_158 = local_16c;
        }
        else {
          puVar16 = local_168 + 2;
          puVar7 = local_168;
          local_150 = puVar16;
        }
        pbVar18 = *(byte **)puVar7;
        uVar20 = 0xffffffff;
      }
      else {
        if (bVar14 != 100) goto LAB_0010a69e;
        if (local_16c < 0x29) {
          uVar21 = (ulong)local_16c;
          local_16c = local_16c + 8;
          puVar7 = (uint *)(local_160 + uVar21);
          local_158 = local_16c;
        }
        else {
          puVar16 = local_168 + 2;
          puVar7 = local_168;
          local_150 = puVar16;
        }
        uVar20 = *puVar7;
        if ((int)uVar20 < 0) {
          lemon_addtext(str,(int *)local_170,"-",1,iVar5);
          uVar20 = -uVar20;
        }
        else if (uVar20 == 0) {
          lemon_addtext(str,(int *)local_170,"0",1,iVar5);
          uVar20 = 0;
        }
        uVar21 = 0;
        if (0 < (int)uVar20) {
          do {
            abStack_f7[uVar21] = (char)uVar20 + (char)(uVar20 / 10) * -10 | 0x30;
            uVar21 = uVar21 - 1;
            bVar4 = 9 < uVar20;
            uVar20 = uVar20 / 10;
          } while (bVar4);
          uVar21 = (ulong)(uint)-(int)uVar21;
        }
        uVar20 = (uint)uVar21;
        pbVar18 = abStack_f7 + (1 - uVar21);
      }
LAB_0010a64e:
      lemon_addtext(str,(int *)local_170,(char *)pbVar18,uVar20,iVar5);
    }
    iVar5 = uVar19 + 1;
    format = (char *)local_138;
  }
  else if (((byte *)format)[lVar22] == 0) {
    lemon_addtext(str,(int *)local_170,(char *)((byte *)format + iVar5),uVar19 - iVar5,0);
    return extraout_EAX;
  }
  uVar19 = uVar19 + 1;
  goto LAB_0010a390;
}

Assistant:

static int lemon_sprintf(char *str, const char *format, ...){
  va_list ap;
  int rc;
  va_start(ap, format);
  rc = lemon_vsprintf(str, format, ap);
  va_end(ap);
  return rc;
}